

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O0

bool __thiscall cmDocumentation::PrintDocumentation(cmDocumentation *this,Type ht,ostream *os)

{
  ostream *os_local;
  Type ht_local;
  cmDocumentation *this_local;
  
  switch(ht) {
  case Version:
    this_local._7_1_ = PrintVersion(this,os);
    break;
  case Usage:
    this_local._7_1_ = PrintUsage(this,os);
    break;
  case Help:
    this_local._7_1_ = PrintHelp(this,os);
    break;
  case Full:
    this_local._7_1_ = PrintHelpFull(this,os);
    break;
  case ListManuals:
    this_local._7_1_ = PrintHelpListManuals(this,os);
    break;
  case ListCommands:
    this_local._7_1_ = PrintHelpListCommands(this,os);
    break;
  case ListModules:
    this_local._7_1_ = PrintHelpListModules(this,os);
    break;
  case ListProperties:
    this_local._7_1_ = PrintHelpListProperties(this,os);
    break;
  case ListVariables:
    this_local._7_1_ = PrintHelpListVariables(this,os);
    break;
  case ListPolicies:
    this_local._7_1_ = PrintHelpListPolicies(this,os);
    break;
  case ListGenerators:
    this_local._7_1_ = PrintHelpListGenerators(this,os);
    break;
  case OneManual:
    this_local._7_1_ = PrintHelpOneManual(this,os);
    break;
  case OneCommand:
    this_local._7_1_ = PrintHelpOneCommand(this,os);
    break;
  case OneModule:
    this_local._7_1_ = PrintHelpOneModule(this,os);
    break;
  case OneProperty:
    this_local._7_1_ = PrintHelpOneProperty(this,os);
    break;
  case OneVariable:
    this_local._7_1_ = PrintHelpOneVariable(this,os);
    break;
  case OnePolicy:
    this_local._7_1_ = PrintHelpOnePolicy(this,os);
    break;
  case OldCustomModules:
    this_local._7_1_ = PrintOldCustomModules(this,os);
    break;
  default:
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmDocumentation::PrintDocumentation(Type ht, std::ostream& os)
{
  switch (ht) {
    case cmDocumentation::Usage:
      return this->PrintUsage(os);
    case cmDocumentation::Help:
      return this->PrintHelp(os);
    case cmDocumentation::Full:
      return this->PrintHelpFull(os);
    case cmDocumentation::OneManual:
      return this->PrintHelpOneManual(os);
    case cmDocumentation::OneCommand:
      return this->PrintHelpOneCommand(os);
    case cmDocumentation::OneModule:
      return this->PrintHelpOneModule(os);
    case cmDocumentation::OnePolicy:
      return this->PrintHelpOnePolicy(os);
    case cmDocumentation::OneProperty:
      return this->PrintHelpOneProperty(os);
    case cmDocumentation::OneVariable:
      return this->PrintHelpOneVariable(os);
    case cmDocumentation::ListManuals:
      return this->PrintHelpListManuals(os);
    case cmDocumentation::ListCommands:
      return this->PrintHelpListCommands(os);
    case cmDocumentation::ListModules:
      return this->PrintHelpListModules(os);
    case cmDocumentation::ListProperties:
      return this->PrintHelpListProperties(os);
    case cmDocumentation::ListVariables:
      return this->PrintHelpListVariables(os);
    case cmDocumentation::ListPolicies:
      return this->PrintHelpListPolicies(os);
    case cmDocumentation::ListGenerators:
      return this->PrintHelpListGenerators(os);
    case cmDocumentation::Version:
      return this->PrintVersion(os);
    case cmDocumentation::OldCustomModules:
      return this->PrintOldCustomModules(os);
    default:
      return false;
  }
}